

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O2

void __thiscall
slang::ast::SFormat::TypeVisitor::visit(TypeVisitor *this,EnumType *type,ConstantValue *arg)

{
  char *begin;
  _Alloc_hider _Var1;
  bool bVar2;
  ConstantValue *lhs;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  sVar3;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __begin3;
  string local_48;
  
  sVar3 = Scope::membersOfType<slang::ast::EnumValueSymbol>(&type->super_Scope);
  local_48._M_dataplus._M_p = (pointer)sVar3._M_begin.current;
  while( true ) {
    _Var1._M_p = local_48._M_dataplus._M_p;
    if ((Symbol *)local_48._M_dataplus._M_p == sVar3._M_end.current.current) {
      ConstantValue::toString_abi_cxx11_(&local_48,arg,0x80,false,false);
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)&this->buffer,local_48._M_dataplus._M_p,
                 local_48._M_dataplus._M_p + local_48._M_string_length);
      std::__cxx11::string::~string((string *)&local_48);
      return;
    }
    lhs = EnumValueSymbol::getValue
                    ((EnumValueSymbol *)local_48._M_dataplus._M_p,(SourceRange)ZEXT816(0));
    bVar2 = slang::operator==(lhs,arg);
    if (bVar2) break;
    Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>::increment
              ((specific_symbol_iterator<slang::ast::EnumValueSymbol> *)&local_48);
  }
  begin = *(char **)(_Var1._M_p + 0x10);
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)&this->buffer,begin,begin + ((string_view *)(_Var1._M_p + 8))->_M_len);
  return;
}

Assistant:

void visit(const EnumType& type, const ConstantValue& arg) {
        for (auto& member : type.values()) {
            if (member.getValue() == arg) {
                buffer.append(member.name);
                return;
            }
        }
        buffer.append(arg.toString());
    }